

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSet<char16_t>::IsEqualTo(CharSet<char16_t> *this,CharSet<char16_t> *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  CharSetNode *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint i;
  uint index;
  bool bVar8;
  
  sVar2 = (this->rep).compact.countPlusOne;
  sVar3 = (other->rep).compact.countPlusOne;
  uVar1 = sVar3 - 1;
  if (sVar2 - 1 < 5) {
    index = 0;
    bVar8 = false;
    if (sVar2 == sVar3 && uVar1 < 5) {
      do {
        uVar6 = GetCompactLength(this);
        bVar8 = uVar6 <= index;
        if (bVar8) {
          return bVar8;
        }
        uVar6 = GetCompactCharU(this,index);
        bVar5 = Get(other,(Char)uVar6);
        index = index + 1;
      } while (bVar5);
    }
  }
  else if ((uVar1 < 5) ||
          (bVar8 = CharBitvec::IsEqualTo(&(this->rep).full.direct,&(other->rep).full.direct), !bVar8
          )) {
    bVar8 = false;
  }
  else {
    pCVar4 = (this->rep).full.root;
    bVar8 = (other->rep).compact.countPlusOne == 0;
    if (pCVar4 != (CharSetNode *)0x0 && !bVar8) {
      iVar7 = (*pCVar4->_vptr_CharSetNode[10])(pCVar4,2);
      return SUB41(iVar7,0);
    }
    bVar8 = (pCVar4 == (CharSetNode *)0x0) == bVar8;
  }
  return bVar8;
}

Assistant:

bool CharSet<char16>::IsEqualTo(const CharSet<Char>& other) const
    {
        if (IsCompact())
        {
            if (!other.IsCompact())
                return false;
            if (rep.compact.countPlusOne != other.rep.compact.countPlusOne)
                return false;
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                if (!other.Get(this->GetCompactChar(i)))
                    return false;
            }
            return true;
        }
        else
        {
            if (other.IsCompact())
                return false;
            if (!rep.full.direct.IsEqualTo(other.rep.full.direct))
                return false;
            if ((rep.full.root == nullptr) != (other.rep.full.root == nullptr))
                return false;
            if (rep.full.root == nullptr)
                return true;
            return rep.full.root->IsEqualTo(CharSetNode::levels - 1, other.rep.full.root);
        }
    }